

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.h
# Opt level: O2

void dgSort<dgHullVertex>
               (dgHullVertex *array,HaI32 elements,
               _func_HaI32_dgHullVertex_ptr_dgHullVertex_ptr_void_ptr *compare,void *context)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  HaI32 HVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  dgHullVertex *pdVar17;
  int iVar18;
  long lVar19;
  dgHullVertex *pdVar20;
  dgHullVertex *pdVar21;
  long lVar22;
  dgHullVertex val;
  dgHullVertex tmp;
  int aiStack_2040 [2];
  HaI32 stack [1024] [2];
  
  stack[0][0] = 0;
  stack[0][1] = elements + -1;
  iVar15 = 1;
  do {
    do {
      iVar14 = iVar15;
      if (iVar14 == 0) {
        iVar15 = 0x10;
        if (elements < 0x10) {
          iVar15 = elements;
        }
        pdVar17 = array;
        for (lVar19 = 1; pdVar21 = pdVar17 + 1, lVar19 < iVar15; lVar19 = lVar19 + 1) {
          HVar13 = (*compare)(array,pdVar21,context);
          if (0 < HVar13) {
            val.m_index = array->m_index;
            val._36_4_ = *(undefined4 *)&array->field_0x24;
            val.super_dgBigVector.super_dgTemplateVector<double>.m_x =
                 (array->super_dgBigVector).super_dgTemplateVector<double>.m_x;
            val.super_dgBigVector.super_dgTemplateVector<double>.m_y =
                 (array->super_dgBigVector).super_dgTemplateVector<double>.m_y;
            val.super_dgBigVector.super_dgTemplateVector<double>.m_z =
                 (array->super_dgBigVector).super_dgTemplateVector<double>.m_z;
            val.super_dgBigVector.super_dgTemplateVector<double>.m_w =
                 (array->super_dgBigVector).super_dgTemplateVector<double>.m_w;
            array->m_index = pdVar17[1].m_index;
            dVar4 = pdVar17[1].super_dgBigVector.super_dgTemplateVector<double>.m_y;
            dVar5 = pdVar17[1].super_dgBigVector.super_dgTemplateVector<double>.m_z;
            dVar6 = pdVar17[1].super_dgBigVector.super_dgTemplateVector<double>.m_w;
            (array->super_dgBigVector).super_dgTemplateVector<double>.m_x =
                 (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_x;
            (array->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar4;
            (array->super_dgBigVector).super_dgTemplateVector<double>.m_z = dVar5;
            (array->super_dgBigVector).super_dgTemplateVector<double>.m_w = dVar6;
            pdVar17[1].m_index = val.m_index;
            (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_x =
                 val.super_dgBigVector.super_dgTemplateVector<double>.m_x;
            pdVar17[1].super_dgBigVector.super_dgTemplateVector<double>.m_y =
                 val.super_dgBigVector.super_dgTemplateVector<double>.m_y;
            pdVar17[1].super_dgBigVector.super_dgTemplateVector<double>.m_z =
                 val.super_dgBigVector.super_dgTemplateVector<double>.m_z;
            pdVar17[1].super_dgBigVector.super_dgTemplateVector<double>.m_w =
                 val.super_dgBigVector.super_dgTemplateVector<double>.m_w;
          }
          pdVar17 = pdVar21;
        }
        lVar19 = 1;
        pdVar17 = array;
        do {
          if (elements <= lVar19) {
            return;
          }
          val.m_index = array[lVar19].m_index;
          val._36_4_ = *(undefined4 *)&array[lVar19].field_0x24;
          pdVar21 = array + lVar19;
          val.super_dgBigVector.super_dgTemplateVector<double>.m_x =
               (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_x;
          val.super_dgBigVector.super_dgTemplateVector<double>.m_y =
               (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_y;
          val.super_dgBigVector.super_dgTemplateVector<double>.m_z =
               (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_z;
          val.super_dgBigVector.super_dgTemplateVector<double>.m_w =
               (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_w;
          pdVar21 = pdVar17;
          lVar16 = lVar19;
          while (HVar13 = (*compare)(pdVar21,&val,context), 0 < HVar13) {
            if (lVar16 < 1) {
              __assert_fail("j > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.h"
                            ,0x124,
                            "void dgSort(T *const, hacd::HaI32, hacd::HaI32 (*)(const T *const, const T *const, void *const), void *const) [T = dgHullVertex]"
                           );
            }
            lVar16 = lVar16 + -1;
            pdVar21[1].m_index = pdVar21->m_index;
            dVar4 = (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_y;
            dVar5 = (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_z;
            dVar6 = (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_w;
            pdVar21[1].super_dgBigVector.super_dgTemplateVector<double>.m_x =
                 (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_x;
            pdVar21[1].super_dgBigVector.super_dgTemplateVector<double>.m_y = dVar4;
            pdVar21[1].super_dgBigVector.super_dgTemplateVector<double>.m_z = dVar5;
            pdVar21[1].super_dgBigVector.super_dgTemplateVector<double>.m_w = dVar6;
            pdVar21 = pdVar21 + -1;
          }
          lVar19 = lVar19 + 1;
          pdVar17 = pdVar17 + 1;
          pdVar21[1].m_index = val.m_index;
          pdVar21[1].super_dgBigVector.super_dgTemplateVector<double>.m_x =
               val.super_dgBigVector.super_dgTemplateVector<double>.m_x;
          pdVar21[1].super_dgBigVector.super_dgTemplateVector<double>.m_y =
               val.super_dgBigVector.super_dgTemplateVector<double>.m_y;
          pdVar21[1].super_dgBigVector.super_dgTemplateVector<double>.m_z =
               val.super_dgBigVector.super_dgTemplateVector<double>.m_z;
          pdVar21[1].super_dgBigVector.super_dgTemplateVector<double>.m_w =
               val.super_dgBigVector.super_dgTemplateVector<double>.m_w;
        } while( true );
      }
      lVar19 = (long)iVar14;
      iVar1 = stack[lVar19 + -1][1];
      iVar2 = aiStack_2040[lVar19 * 2];
      iVar15 = iVar14 + -1;
    } while (iVar1 - iVar2 < 9);
    iVar12 = iVar1 + iVar2 >> 1;
    val.m_index = array[iVar12].m_index;
    val._36_4_ = *(undefined4 *)&array[iVar12].field_0x24;
    pdVar17 = array + iVar12;
    val.super_dgBigVector.super_dgTemplateVector<double>.m_x =
         (pdVar17->super_dgBigVector).super_dgTemplateVector<double>.m_x;
    val.super_dgBigVector.super_dgTemplateVector<double>.m_y =
         (pdVar17->super_dgBigVector).super_dgTemplateVector<double>.m_y;
    val.super_dgBigVector.super_dgTemplateVector<double>.m_z =
         (pdVar17->super_dgBigVector).super_dgTemplateVector<double>.m_z;
    val.super_dgBigVector.super_dgTemplateVector<double>.m_w =
         (pdVar17->super_dgBigVector).super_dgTemplateVector<double>.m_w;
    iVar12 = iVar2;
    iVar18 = iVar1;
    do {
      lVar16 = (long)iVar12 + -1;
      pdVar17 = array + iVar12;
      iVar11 = iVar12;
      do {
        iVar12 = iVar11;
        pdVar21 = pdVar17;
        HVar13 = (*compare)(pdVar21,&val,context);
        lVar16 = lVar16 + 1;
        pdVar17 = pdVar21 + 1;
        iVar11 = iVar12 + 1;
      } while (HVar13 < 0);
      lVar22 = (long)iVar18 + 1;
      pdVar17 = array + iVar18;
      iVar11 = iVar18;
      do {
        iVar18 = iVar11;
        pdVar20 = pdVar17;
        HVar13 = (*compare)(pdVar20,&val,context);
        lVar22 = lVar22 + -1;
        pdVar17 = pdVar20 + -1;
        iVar11 = iVar18 + -1;
      } while (0 < HVar13);
      if (lVar16 <= lVar22) {
        uVar3 = *(undefined8 *)&pdVar21->m_index;
        dVar4 = (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_x;
        dVar5 = (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_y;
        dVar6 = (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_z;
        dVar7 = (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_w;
        pdVar21->m_index = pdVar20->m_index;
        dVar8 = (pdVar20->super_dgBigVector).super_dgTemplateVector<double>.m_y;
        dVar9 = (pdVar20->super_dgBigVector).super_dgTemplateVector<double>.m_z;
        dVar10 = (pdVar20->super_dgBigVector).super_dgTemplateVector<double>.m_w;
        (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_x =
             (pdVar20->super_dgBigVector).super_dgTemplateVector<double>.m_x;
        (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar8;
        (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_z = dVar9;
        (pdVar21->super_dgBigVector).super_dgTemplateVector<double>.m_w = dVar10;
        tmp.m_index = (HaI32)uVar3;
        pdVar20->m_index = tmp.m_index;
        (pdVar20->super_dgBigVector).super_dgTemplateVector<double>.m_x = dVar4;
        (pdVar20->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar5;
        (pdVar20->super_dgBigVector).super_dgTemplateVector<double>.m_z = dVar6;
        (pdVar20->super_dgBigVector).super_dgTemplateVector<double>.m_w = dVar7;
        iVar12 = iVar12 + 1;
        iVar18 = iVar18 + -1;
      }
    } while (iVar12 <= iVar18);
    if (iVar12 < iVar1) {
      stack[lVar19 + -1][0] = iVar12;
      iVar15 = iVar14;
    }
    if (iVar2 < iVar18) {
      stack[iVar15][0] = iVar2;
      stack[iVar15][1] = iVar18;
      iVar15 = iVar15 + 1;
    }
  } while (iVar15 < 0x400);
  __assert_fail("stackIndex < hacd::HaI32 (sizeof (stack) / (2 * sizeof (stack[0][0])))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.h"
                ,0x10f,
                "void dgSort(T *const, hacd::HaI32, hacd::HaI32 (*)(const T *const, const T *const, void *const), void *const) [T = dgHullVertex]"
               );
}

Assistant:

void dgSort (T* const array, hacd::HaI32 elements, hacd::HaI32 (*compare) (const T* const  A, const T* const B, void* const context), void* const context = NULL)
{
	hacd::HaI32 stride = 8;
	hacd::HaI32 stack[1024][2];

	stack[0][0] = 0;
	stack[0][1] = elements - 1;
	hacd::HaI32 stackIndex = 1;
	while (stackIndex) {
		stackIndex --;
		hacd::HaI32 lo = stack[stackIndex][0];
		hacd::HaI32 hi = stack[stackIndex][1];
		if ((hi - lo) > stride) {
			hacd::HaI32 i = lo;
			hacd::HaI32 j = hi;
			T val (array[(lo + hi) >> 1]);
			do {    
				while (compare (&array[i], &val, context) < 0) i ++;
				while (compare (&array[j], &val, context) > 0) j --;

				if (i <= j)	{
					T tmp (array[i]);
					array[i] = array[j]; 
					array[j] = tmp;
					i++; 
					j--;
				}
			} while (i <= j);

			if (i < hi) {
				stack[stackIndex][0] = i;
				stack[stackIndex][1] = hi;
				stackIndex ++;
			}
			if (lo < j) {
				stack[stackIndex][0] = lo;
				stack[stackIndex][1] = j;
				stackIndex ++;
			}
			HACD_ASSERT (stackIndex < hacd::HaI32 (sizeof (stack) / (2 * sizeof (stack[0][0]))));
		}
	}

	stride = stride * 2;
	if (elements < stride) {
		stride = elements;
	}
	for (hacd::HaI32 i = 1; i < stride; i ++) {
		if (compare (&array[0], &array[i], context) > 0) {
			T tmp (array[0]);
			array[0] = array[i];
			array[i] = tmp;
		}
	}

	for (hacd::HaI32 i = 1; i < elements; i ++) {
		hacd::HaI32 j = i;
		T tmp (array[i]);
		//for (; j && (compare (&array[j - 1], &tmp, context) > 0); j --) {
		for (; compare (&array[j - 1], &tmp, context) > 0; j --) {
			HACD_ASSERT (j > 0);
			array[j] = array[j - 1];
		}
		array[j] = tmp;
	}

#ifdef _DEBUG
	for (hacd::HaI32 i = 0; i < (elements - 1); i ++) {
		HACD_ASSERT (compare (&array[i], &array[i + 1], context) <= 0);
	}
#endif
}